

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element_position_bitmask_table.hpp
# Opt level: O1

void __thiscall
burst::algorithm::detail::
element_position_bitmask_table<std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::initialize<std::_Fwd_list_const_iterator<int>>
          (element_position_bitmask_table<std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> first,_Fwd_list_const_iterator<int> last)

{
  mapped_type *pmVar1;
  long lVar2;
  ulong uVar3;
  
  if (first._M_node == last._M_node) {
    lVar2 = 0;
  }
  else {
    uVar3 = 1;
    lVar2 = 0;
    do {
      pmVar1 = std::
               map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>
               ::operator[]((map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>
                             *)this,(key_type_conflict *)(first._M_node + 1));
      (pmVar1->super__Base_bitset<1UL>)._M_w = (pmVar1->super__Base_bitset<1UL>)._M_w | uVar3;
      first._M_node = (first._M_node)->_M_next;
      uVar3 = (ulong)(uint)((int)uVar3 * 2);
      lVar2 = lVar2 + 1;
    } while (first._M_node != last._M_node);
  }
  *(long *)(this + 0x30) = lVar2;
  return;
}

Assistant:

void initialize (InputIterator first, InputIterator last)
                {
                    using iterated_type = iterator_value_t<InputIterator>;
                    static_assert(std::is_same<iterated_type, key_type>::value,
                        "Неверно задан тип входного элемента.");

                    auto elements_count = std::size_t{0};

                    auto position_indicator = bitmask_type{0b1};
                    while (first != last)
                    {
                        m_bitmasks[*first] |= position_indicator;

                        ++first;
                        position_indicator = left_shift(position_indicator, 1u);
                        ++elements_count;
                    }

                    m_sequence_length = elements_count;
                }